

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_module_ns_has(JSContext *ctx,JSValue obj,JSAtom atom)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint *puVar4;
  
  lVar2 = *(long *)((long)obj.u.ptr + 0x18);
  uVar3 = *(uint *)(lVar2 + ~(ulong)(*(uint *)(lVar2 + 0x20) & atom) * 4);
  while (uVar3 != 0) {
    lVar1 = lVar2 + 0x40 + (ulong)uVar3 * 8;
    puVar4 = (uint *)(lVar1 + -8);
    if (*(JSAtom *)(lVar1 + -4) == atom) goto LAB_00133e88;
    uVar3 = *puVar4 & 0x3ffffff;
  }
  puVar4 = (uint *)0x0;
LAB_00133e88:
  return (int)(puVar4 != (uint *)0x0);
}

Assistant:

static force_inline JSShapeProperty *find_own_property1(JSObject *p,
                                                        JSAtom atom)
{
    JSShape *sh;
    JSShapeProperty *pr, *prop;
    intptr_t h;
    sh = p->shape;
    h = (uintptr_t)atom & sh->prop_hash_mask;
    h = prop_hash_end(sh)[-h - 1];
    prop = get_shape_prop(sh);
    while (h) {
        pr = &prop[h - 1];
        if (likely(pr->atom == atom)) {
            return pr;
        }
        h = pr->hash_next;
    }
    return NULL;
}